

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CaptureEmptySourceAndNoGroups
               (Program *program)

{
  code *pcVar1;
  bool bVar2;
  char16_t **ppcVar3;
  undefined4 *puVar4;
  Program *program_local;
  
  ppcVar3 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)program);
  if (*ppcVar3 != (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbed,"(program->source == 0)","program->source == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Memory::WriteBarrierPtr<char16_t>::operator=(&program->source,L"");
  program->sourceLen = 0;
  program->numGroups = 1;
  return;
}

Assistant:

void Parser<P, IsLiteral>::CaptureEmptySourceAndNoGroups(Program* program)
    {
        Assert(program->source == 0);

        program->source = const_cast<Char*>(_u(""));
        program->sourceLen = 0;

        program->numGroups = 1;

        // Remaining to set during compilation: litbuf, litbufLen, numLoops, insts, instsLen, entryPointLabel
    }